

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32_c_api_tests.c
# Opt level: O3

void encode_whenCppMethodThrowsException_isUnsuccessful(void)

{
  bech32_error bVar1;
  size_t hrplen;
  bech32_bstring *bstring;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  uchar dp [3];
  char hrp [85];
  uchar local_7c [4];
  char local_78 [80];
  undefined4 local_28;
  undefined1 local_24;
  
  pcVar3 = "aaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaa";
  pcVar4 = local_78;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(undefined8 *)pcVar4 = *(undefined8 *)pcVar3;
    pcVar3 = pcVar3 + 8;
    pcVar4 = pcVar4 + 8;
  }
  local_24 = 0;
  local_28 = 0x61616161;
  local_7c[2] = 3;
  local_7c[0] = '\x01';
  local_7c[1] = '\x02';
  hrplen = strlen(local_78);
  bstring = bech32_create_bstring(hrplen,3);
  bVar1 = bech32_encode(bstring,local_78,local_7c,3);
  if (bVar1 == E_BECH32_UNKNOWN_ERROR) {
    bech32_free_bstring(bstring);
    return;
  }
  __assert_fail("bech32_encode(bstring, hrp, dp, sizeof(dp)) == E_BECH32_UNKNOWN_ERROR",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                ,0x129,"void encode_whenCppMethodThrowsException_isUnsuccessful(void)");
}

Assistant:

void encode_whenCppMethodThrowsException_isUnsuccessful(void) {
    // bech32 string can only have HRPs that are 83 chars or less. Attempt to encode an HRP string
    // with more than 83 chars and make sure that the exception thrown in the C++ code is caught
    // and returns an error code
    char hrp[] = "aaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaa";
    unsigned char dp[] = {1,2,3};
    bech32_bstring *bstring = bech32_create_bstring(strlen(hrp), sizeof(dp));

    assert(bech32_encode(bstring, hrp, dp, sizeof(dp)) == E_BECH32_UNKNOWN_ERROR);

    bech32_free_bstring(bstring);
}